

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O1

bool __thiscall ParsedJson::iterator::prev(iterator *this)

{
  size_t sVar1;
  ulong uVar2;
  uint64_t *puVar3;
  uint64_t uVar4;
  ulong uVar5;
  byte bVar6;
  
  sVar1 = this->location;
  uVar5 = sVar1 - 1;
  uVar2 = this->depthindex[this->depth].start_of_scope;
  if (uVar2 <= uVar5) {
    this->location = uVar5;
    puVar3 = this->pj->tape;
    uVar5 = puVar3[sVar1 - 1];
    this->current_val = uVar5;
    bVar6 = (byte)(uVar5 >> 0x38);
    this->current_type = bVar6;
    if ((bVar6 | 0x20) != 0x7d) {
      return true;
    }
    uVar5 = uVar5 & 0xffffffffffffff;
    if (uVar2 <= uVar5) {
      this->location = uVar5;
      uVar4 = puVar3[uVar5];
      this->current_val = uVar4;
      this->current_type = (uint8_t)(uVar4 >> 0x38);
      return true;
    }
  }
  return false;
}

Assistant:

bool ParsedJson::iterator::prev() {
    if(location - 1 < depthindex[depth].start_of_scope) { return false;
}
    location -= 1;
    current_val = pj.tape[location];
    current_type = (current_val >> 56);
    if ((current_type == ']') || (current_type == '}')){
    // we need to jump
    size_t new_location = ( current_val & JSONVALUEMASK);
    if(new_location < depthindex[depth].start_of_scope) {
        return false; // shoud never happen
    }
    location = new_location;
    current_val = pj.tape[location];
    current_type = (current_val >> 56);
    }
    return true;
}